

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

char * deqp::gls::RandomArrayGenerator::createPerQuads<deqp::gls::GLValue::WrappedFloatType<double>>
                 (int seed,int count,int componentCount,int stride,Primitive primitive,
                 WrappedFloatType<double> min,WrappedFloatType<double> max)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  float fVar7;
  WrappedFloatType<double> WVar8;
  deRandom rnd;
  ulong local_b0;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  iVar5 = componentCount * 8;
  if (stride != 0) {
    iVar5 = stride;
  }
  iVar4 = iVar5 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar4 = 0;
  }
  pcVar2 = (char *)operator_new__((long)(iVar4 * count));
  if (0 < count) {
    local_b0 = 0;
    do {
      if (0 < componentCount) {
        iVar1 = iVar4 * (int)local_b0;
        lVar6 = 0;
        do {
          WVar8.m_value = min.m_value;
          if (min.m_value <= max.m_value) {
            fVar7 = deRandom_getFloat(&local_40);
            WVar8.m_value =
                 (double)(fVar7 * ((float)max.m_value - (float)min.m_value)) + min.m_value;
          }
          lVar3 = (long)(int)lVar6;
          *(double *)(pcVar2 + lVar3 + iVar1) = WVar8.m_value;
          *(double *)(pcVar2 + lVar3 + (long)iVar5 + (long)iVar1) = WVar8.m_value;
          *(double *)(pcVar2 + lVar3 + (long)(iVar5 * 2) + (long)iVar1) = WVar8.m_value;
          *(double *)(pcVar2 + lVar3 + (long)(iVar5 * 3) + (long)iVar1) = WVar8.m_value;
          *(double *)(pcVar2 + lVar3 + (long)(iVar5 << 2) + (long)iVar1) = WVar8.m_value;
          *(double *)(pcVar2 + lVar3 + (long)(iVar5 * 5) + (long)iVar1) = WVar8.m_value;
          lVar6 = lVar6 + 8;
        } while ((ulong)(uint)componentCount << 3 != lVar6);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != (uint)count);
  }
  return pcVar2;
}

Assistant:

char* RandomArrayGenerator::createPerQuads (int seed, int count, int componentCount, int stride, Array::Primitive primitive, T min, T max)
{
	deRandom rnd;
	deRandom_init(&rnd, seed);

	int componentStride = sizeof(T);

	if (stride == 0)
		stride = componentStride * componentCount;

	int quadStride = 0;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* data = new char[count * quadStride];

	for (int quadNdx = 0; quadNdx < count; quadNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			T val = getRandom<T>(rnd, min, max);

			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 0 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 1 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 2 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 3 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 4 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 5 + componentStride * componentNdx, val);
		}
	}

	return data;
}